

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_metric.hpp
# Opt level: O3

Tensor<3> * __thiscall
Omega_h::average_metric<3,4>
          (Tensor<3> *__return_storage_ptr__,Omega_h *this,Few<Omega_h::Matrix<3,_3>,_4> ms,
          bool has_degen)

{
  double dVar1;
  double dVar2;
  Tensor<3> *pTVar3;
  Int j_1;
  Int i_2;
  long lVar4;
  double *pdVar5;
  Int j;
  Int i;
  long lVar6;
  long lVar7;
  Matrix<3,_3> *pMVar8;
  double *pdVar9;
  double *pdVar10;
  int iVar11;
  byte bVar12;
  Matrix<3,_3> c_2;
  Vector<3> c_3;
  Matrix<3,_3> am;
  double adStack_248 [9];
  Tensor<3> *local_200;
  double local_1f8 [4];
  double local_1d8 [4];
  double local_1b8 [12];
  double local_158 [10];
  double local_108 [9];
  double local_c0 [9];
  double local_78 [9];
  
  bVar12 = 0;
  lVar6 = 0;
  local_78[2] = 0.0;
  local_78[0] = 0.0;
  local_78[1] = 0.0;
  local_78[3] = 0.0;
  local_78[4] = 0.0;
  local_78[5] = 0.0;
  local_78[6] = 0.0;
  local_78[7] = 0.0;
  local_78[8] = 0.0;
  pdVar9 = local_1b8 + 3;
  iVar11 = 0;
  local_200 = __return_storage_ptr__;
  do {
    if ((char)this == '\0') {
LAB_00355ac5:
      pMVar8 = ms.array_ + lVar6;
      pdVar5 = adStack_248;
      for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
        *pdVar5 = (pMVar8->super_Few<Omega_h::Vector<3>,_3>).array_[0].super_Few<double,_3>.array_
                  [0];
        pMVar8 = (Matrix<3,_3> *)((long)pMVar8 + ((ulong)bVar12 * -2 + 1) * 8);
        pdVar5 = pdVar5 + (ulong)bVar12 * -2 + 1;
      }
      log_spd_old<3>(stack0x00000200);
      pdVar5 = local_c0;
      pdVar10 = pdVar9;
      for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
        *pdVar10 = *pdVar5;
        pdVar5 = pdVar5 + (ulong)bVar12 * -2 + 1;
        pdVar10 = pdVar10 + (ulong)bVar12 * -2 + 1;
      }
      pdVar5 = local_78;
      pdVar10 = local_108;
      for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
        *pdVar10 = *pdVar5;
        pdVar5 = pdVar5 + (ulong)bVar12 * -2 + 1;
        pdVar10 = pdVar10 + (ulong)bVar12 * -2 + 1;
      }
      lVar4 = 0;
      do {
        local_1f8[2] = local_108[lVar4 * 3 + 2];
        local_1f8[0] = local_108[lVar4 * 3];
        local_1f8[1] = local_108[lVar4 * 3 + 1];
        local_1d8[2] = local_1b8[lVar4 * 3 + 5];
        local_1d8[0] = local_1b8[lVar4 * 3 + 3];
        local_1d8[1] = local_1b8[lVar4 * 3 + 4];
        lVar7 = 0;
        do {
          local_1b8[lVar7] = local_1f8[lVar7] + local_1d8[lVar7];
          lVar7 = lVar7 + 1;
        } while (lVar7 != 3);
        local_158[lVar4 * 3] = local_1b8[0];
        local_158[lVar4 * 3 + 1] = local_1b8[1];
        local_158[lVar4 * 3 + 2] = local_1b8[2];
        lVar4 = lVar4 + 1;
      } while (lVar4 != 3);
      pdVar5 = local_158;
      pdVar10 = local_78;
      for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
        *pdVar10 = *pdVar5;
        pdVar5 = pdVar5 + (ulong)bVar12 * -2 + 1;
        pdVar10 = pdVar10 + (ulong)bVar12 * -2 + 1;
      }
      iVar11 = iVar11 + 1;
    }
    else {
      pMVar8 = ms.array_ + lVar6;
      pdVar5 = pdVar9;
      for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
        *pdVar5 = (pMVar8->super_Few<Omega_h::Vector<3>,_3>).array_[0].super_Few<double,_3>.array_
                  [0];
        pMVar8 = (Matrix<3,_3> *)((long)pMVar8 + ((ulong)bVar12 * -2 + 1) * 8);
        pdVar5 = pdVar5 + (ulong)bVar12 * -2 + 1;
      }
      dVar1 = 0.0;
      lVar4 = 0;
      pdVar5 = pdVar9;
      do {
        lVar7 = 0;
        dVar2 = dVar1;
        do {
          dVar1 = ABS(pdVar5[lVar7]);
          if (ABS(pdVar5[lVar7]) <= dVar2) {
            dVar1 = dVar2;
          }
          lVar7 = lVar7 + 1;
          dVar2 = dVar1;
        } while (lVar7 != 3);
        lVar4 = lVar4 + 1;
        pdVar5 = pdVar5 + 3;
      } while (lVar4 != 3);
      if (1e-10 <= dVar1) goto LAB_00355ac5;
    }
    pTVar3 = local_200;
    lVar6 = lVar6 + 1;
    if (lVar6 == 4) {
      if ((char)this == '\x01' && iVar11 == 0) {
        pdVar9 = local_78;
        for (lVar6 = 9; lVar6 != 0; lVar6 = lVar6 + -1) {
          (local_200->super_Few<Omega_h::Vector<3>,_3>).array_[0].super_Few<double,_3>.array_[0] =
               *pdVar9;
          pdVar9 = pdVar9 + (ulong)bVar12 * -2 + 1;
          local_200 = (Tensor<3> *)((long)local_200 + ((ulong)bVar12 * -2 + 1) * 8);
        }
      }
      else {
        pdVar9 = local_78;
        pdVar5 = local_1b8 + 3;
        for (lVar6 = 9; lVar6 != 0; lVar6 = lVar6 + -1) {
          *pdVar5 = *pdVar9;
          pdVar9 = pdVar9 + (ulong)bVar12 * -2 + 1;
          pdVar5 = pdVar5 + (ulong)bVar12 * -2 + 1;
        }
        lVar6 = 0;
        do {
          local_158[2] = local_1b8[lVar6 * 3 + 5];
          local_158[0] = local_1b8[lVar6 * 3 + 3];
          local_158[1] = local_1b8[lVar6 * 3 + 4];
          lVar4 = 0;
          do {
            local_c0[lVar4] = local_158[lVar4] / (double)iVar11;
            lVar4 = lVar4 + 1;
          } while (lVar4 != 3);
          local_108[lVar6 * 3] = local_c0[0];
          local_108[lVar6 * 3 + 1] = local_c0[1];
          local_108[lVar6 * 3 + 2] = local_c0[2];
          lVar6 = lVar6 + 1;
        } while (lVar6 != 3);
        pdVar9 = local_108;
        pdVar5 = local_1b8 + 3;
        for (lVar6 = 9; lVar6 != 0; lVar6 = lVar6 + -1) {
          *pdVar5 = *pdVar9;
          pdVar9 = pdVar9 + (ulong)bVar12 * -2 + 1;
          pdVar5 = pdVar5 + (ulong)bVar12 * -2 + 1;
        }
        pdVar9 = local_1b8 + 3;
        pdVar5 = adStack_248;
        for (lVar6 = 9; lVar6 != 0; lVar6 = lVar6 + -1) {
          *pdVar5 = *pdVar9;
          pdVar9 = pdVar9 + (ulong)bVar12 * -2 + 1;
          pdVar5 = pdVar5 + (ulong)bVar12 * -2 + 1;
        }
        exp_spd_old<3>(stack0x00000200);
      }
      return pTVar3;
    }
  } while( true );
}

Assistant:

OMEGA_H_INLINE_BIG Tensor<dim> average_metric(
    Few<Tensor<dim>, n> const ms, bool const has_degen) {
  auto am = zero_matrix<dim, dim>();
  Int ngood = 0;
  for (Int i = 0; i < n; ++i) {
    average_metric_contrib(am, ngood, ms[i], has_degen);
  }
  return average_metric_finish(am, ngood, has_degen);
}